

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

string * __thiscall Tokenizer::type(string *__return_storage_ptr__,Tokenizer *this,string *token)

{
  key_type *__x;
  size_type sVar1;
  size_type sVar2;
  char *pcVar3;
  exception *e;
  allocator<char> local_36;
  allocator<char> local_35;
  int val;
  allocator<char> local_21;
  string *local_20;
  string *token_local;
  Tokenizer *this_local;
  
  local_20 = token;
  token_local = (string *)this;
  this_local = (Tokenizer *)__return_storage_ptr__;
  __x = (key_type *)std::__cxx11::string::operator[]((ulong)token);
  sVar1 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::count
                    (&this->symbol_map,__x);
  if (sVar1 == 0) {
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count(&this->keyword_map,local_20);
    if (sVar2 == 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
      if (*pcVar3 == '_') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"STRING_CONST",&local_36);
        std::allocator<char>::~allocator(&local_36);
      }
      else {
        e._4_4_ = std::__cxx11::stoi(local_20,(size_t *)0x0,10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"INT_CONST",(allocator<char> *)((long)&e + 3));
        std::allocator<char>::~allocator((allocator<char> *)((long)&e + 3));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"KEYWORD",&local_35);
      std::allocator<char>::~allocator(&local_35);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SYMBOL",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::type(const std::string& token) {
    if (symbol_map.count(token[0]) > 0) {
        return "SYMBOL";
    }

    else if (keyword_map.count(token) > 0) {
        return "KEYWORD";
    }

    else if (token[0] == '_') {
        return "STRING_CONST";
    }

    try {
        int val = std::stoi(token);
        return "INT_CONST";
    }
    catch (std::exception& e) {
        return "IDENTIFIER";
    }
}